

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createNot(IRBuilder *this,Value *rhs,string *name)

{
  long lVar1;
  UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *pUVar2;
  Value *local_48;
  string local_40;
  
  local_48 = rhs;
  if (rhs->type_ != Number) {
    __assert_fail("rhs->type() == LiteralType::Number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0xb2,"Value *flow::IRBuilder::createNot(Value *, const std::string &)");
  }
  if (rhs == (Value *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = __dynamic_cast(rhs,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,
                           0);
  }
  if (lVar1 == 0) {
    makeName(&local_40,this,name);
    pUVar2 = insert<flow::UnaryInstr<(flow::UnaryOperator)1,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
                       (this,&local_48,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_40._M_dataplus._M_p = (pointer)~*(ulong *)(lVar1 + 0x48);
    pUVar2 = (UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *)
             IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
                       (this->program_,&this->program_->numbers_,(long *)&local_40);
  }
  return (Value *)pUVar2;
}

Assistant:

Value* IRBuilder::createNot(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(rhs))
    return get(~a->get());

  return insert<INotInstr>(rhs, makeName(name));
}